

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

Promise<unsigned_long> __thiscall kj::anon_unknown_123::AsyncPump::pump(AsyncPump *this)

{
  PromiseArena *pPVar1;
  OwnPromiseNode OVar2;
  ulong uVar3;
  void *pvVar4;
  PromiseNode *extraout_RAX;
  PromiseNode *extraout_RAX_00;
  PromiseArena *in_RSI;
  ulong uVar5;
  TransformPromiseNodeBase *this_00;
  OwnPromiseNode local_58;
  OwnPromiseNode local_50;
  PromiseBase local_48;
  undefined1 local_40 [24];
  
  local_40._0_8_ = *(undefined8 *)(in_RSI->bytes + 0x10);
  uVar3 = local_40._0_8_ - *(long *)(in_RSI->bytes + 0x18);
  if (uVar3 == 0) {
    kj::_::PromiseDisposer::
    alloc<kj::_::ImmediatePromiseNode<unsigned_long>,kj::_::PromiseDisposer,unsigned_long>
              ((PromiseDisposer *)&local_48,(unsigned_long *)local_40);
    this->input = (AsyncInputStream *)local_48.node.ptr;
  }
  else {
    uVar5 = 0x1000;
    if (uVar3 < 0x1000) {
      uVar5 = uVar3;
    }
    (**(code **)(**(long **)in_RSI->bytes + 8))
              (&local_58,*(long **)in_RSI->bytes,in_RSI->bytes + 0x20,1,uVar5);
    OVar2.ptr = local_58.ptr;
    pPVar1 = ((local_58.ptr)->super_PromiseArenaMember).arena;
    if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_58.ptr - (long)pPVar1) < 0x28) {
      pvVar4 = operator_new(0x400);
      this_00 = (TransformPromiseNodeBase *)((long)pvVar4 + 0x3d8);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,&local_58,
                 kj::_::
                 SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:116:15)>
                 ::anon_class_8_1_8991fb9c_for_func::operator());
      *(undefined ***)((long)pvVar4 + 0x3d8) = &PTR_destroy_006216a8;
      *(PromiseArena **)((long)pvVar4 + 0x3f8) = in_RSI;
      *(void **)((long)pvVar4 + 0x3e0) = pvVar4;
    }
    else {
      ((local_58.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
      this_00 = (TransformPromiseNodeBase *)&local_58.ptr[-3].super_PromiseArenaMember.arena;
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,&local_58,
                 kj::_::
                 SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:116:15)>
                 ::anon_class_8_1_8991fb9c_for_func::operator());
      OVar2.ptr[-3].super_PromiseArenaMember.arena = (PromiseArena *)&PTR_destroy_006216a8;
      OVar2.ptr[-1].super_PromiseArenaMember.arena = in_RSI;
      OVar2.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar1;
    }
    local_40._0_8_ = &DAT_0048a171;
    local_40._8_8_ = &DAT_0048a1d0;
    local_40._16_8_ = &DAT_4c0000058b;
    local_50.ptr = &this_00->super_PromiseNode;
    kj::_::PromiseDisposer::
    appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
              ((PromiseDisposer *)&local_48,&local_50,(SourceLocation *)local_40);
    OVar2.ptr = local_50.ptr;
    this->input = (AsyncInputStream *)local_48.node.ptr;
    if ((TransformPromiseNodeBase *)local_50.ptr != (TransformPromiseNodeBase *)0x0) {
      local_50.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
      local_48.node.ptr = (OwnPromiseNode)(OwnPromiseNode)extraout_RAX;
    }
    OVar2.ptr = local_58.ptr;
    if (&(local_58.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
      local_58.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
      local_48.node.ptr = (OwnPromiseNode)(OwnPromiseNode)extraout_RAX_00;
    }
  }
  return (Promise<unsigned_long>)local_48.node.ptr;
}

Assistant:

Promise<uint64_t> pump() {
    // TODO(perf): This could be more efficient by reading half a buffer at a time and then
    //   starting the next read concurrent with writing the data from the previous read.

    uint64_t n = kj::min(limit - doneSoFar, sizeof(buffer));
    if (n == 0) return doneSoFar;

    return input.tryRead(buffer, 1, n)
        .then([this](size_t amount) -> Promise<uint64_t> {
      if (amount == 0) return doneSoFar;  // EOF
      doneSoFar += amount;
      return output.write(arrayPtr(buffer).first(amount)).then([this]() {
        return pump();
      });
    });
  }